

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getOutputFileBaseName_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  string *__return_storage_ptr___00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  __return_storage_ptr___00 = &local_30;
  getSourceFileName_abi_cxx11_(__return_storage_ptr___00,this);
  ::std::operator+(&local_50,__return_storage_ptr___00,".");
  getTestName_abi_cxx11_(&local_70,(ApprovalTestNamer *)__return_storage_ptr___00);
  ::std::operator+(__return_storage_ptr__,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getOutputFileBaseName() const
    {
        return getSourceFileName() + "." + getTestName();
    }